

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

FloatCheckerboardTexture *
pbrt::FloatCheckerboardTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar1;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar2;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar3;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar4;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar5;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar6;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar7;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar8;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar9;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar10;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar11;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar12;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar13;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar14;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar15;
  int iVar16;
  FloatCheckerboardTexture *pFVar17;
  undefined4 extraout_var;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  *pTVar18;
  undefined4 extraout_var_01;
  allocator<char> local_c1;
  FloatTextureHandle tex2;
  FloatTextureHandle tex1;
  int dim;
  TextureMapping2DHandle map;
  undefined4 extraout_var_00;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&map,"dimension",(allocator<char> *)&tex1);
  iVar16 = TextureParameterDictionary::GetOneInt(parameters,(string *)&map,2);
  std::__cxx11::string::~string((string *)&map);
  dim = iVar16;
  if (iVar16 - 4U < 0xfffffffe) {
    Error<int&>(loc,"%d dimensional checkerboard texture not supported",&dim);
    pFVar17 = (FloatCheckerboardTexture *)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&map,"tex1",(allocator<char> *)&tex2);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&tex1,(string *)parameters,1.0,(memory_resource *)&map)
    ;
    std::__cxx11::string::~string((string *)&map);
    std::__cxx11::string::string<std::allocator<char>>((string *)&map,"tex2",&local_c1);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&tex2,(string *)parameters,0.0,(memory_resource *)&map)
    ;
    std::__cxx11::string::~string((string *)&map);
    if (iVar16 == 2) {
      TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
      iVar16 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
      pFVar17 = (FloatCheckerboardTexture *)CONCAT44(extraout_var,iVar16);
      (pFVar17->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = (uintptr_t)
              map.
              super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
              .bits;
      (pFVar17->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits = 0;
      pFVar17->tex[0].
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = (uintptr_t)
              tex1.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
      pFVar17->tex[1].
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = (uintptr_t)
              tex2.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
    }
    else {
      map.
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = *(TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
                *)(renderFromTexture->mInv).m[0];
      TVar1.bits = *(uintptr_t *)((renderFromTexture->mInv).m[0] + 2);
      TVar2.bits = *(uintptr_t *)(renderFromTexture->mInv).m[1];
      TVar3.bits = *(uintptr_t *)((renderFromTexture->mInv).m[1] + 2);
      TVar4.bits = *(uintptr_t *)(renderFromTexture->mInv).m[2];
      TVar5.bits = *(uintptr_t *)((renderFromTexture->mInv).m[2] + 2);
      TVar6.bits = *(uintptr_t *)(renderFromTexture->mInv).m[3];
      TVar7.bits = *(uintptr_t *)((renderFromTexture->mInv).m[3] + 2);
      TVar8.bits = *(uintptr_t *)(renderFromTexture->m).m[0];
      TVar9.bits = *(uintptr_t *)((renderFromTexture->m).m[0] + 2);
      TVar10.bits = *(uintptr_t *)(renderFromTexture->m).m[1];
      TVar11.bits = *(uintptr_t *)((renderFromTexture->m).m[1] + 2);
      TVar12.bits = *(uintptr_t *)(renderFromTexture->m).m[2];
      TVar13.bits = *(uintptr_t *)((renderFromTexture->m).m[2] + 2);
      TVar14.bits = *(uintptr_t *)(renderFromTexture->m).m[3];
      TVar15.bits = *(uintptr_t *)((renderFromTexture->m).m[3] + 2);
      iVar16 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
      pTVar18 = (TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
                 *)CONCAT44(extraout_var_00,iVar16);
      pTVar18->bits =
           (uintptr_t)
           map.
           super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
           .bits;
      pTVar18[1].bits = TVar1.bits;
      pTVar18[2].bits = TVar2.bits;
      pTVar18[3].bits = TVar3.bits;
      pTVar18[4].bits = TVar4.bits;
      pTVar18[5].bits = TVar5.bits;
      pTVar18[6].bits = TVar6.bits;
      pTVar18[7].bits = TVar7.bits;
      pTVar18[8].bits = TVar8.bits;
      pTVar18[9].bits = TVar9.bits;
      pTVar18[10].bits = TVar10.bits;
      pTVar18[0xb].bits = TVar11.bits;
      pTVar18[0xc].bits = TVar12.bits;
      pTVar18[0xd].bits = TVar13.bits;
      pTVar18[0xe].bits = TVar14.bits;
      pTVar18[0xf].bits = TVar15.bits;
      iVar16 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
      pFVar17 = (FloatCheckerboardTexture *)CONCAT44(extraout_var_01,iVar16);
      (pFVar17->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = 0;
      (pFVar17->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits =
           (ulong)pTVar18 | 0x1000000000000;
      pFVar17->tex[0].
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = (uintptr_t)
              tex1.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
      pFVar17->tex[1].
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = (uintptr_t)
              tex2.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
    }
  }
  return pFVar17;
}

Assistant:

FloatCheckerboardTexture *FloatCheckerboardTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    int dim = parameters.GetOneInt("dimension", 2);
    if (dim != 2 && dim != 3) {
        Error(loc, "%d dimensional checkerboard texture not supported", dim);
        return nullptr;
    }
    FloatTextureHandle tex1 = parameters.GetFloatTexture("tex1", 1.f, alloc);
    FloatTextureHandle tex2 = parameters.GetFloatTexture("tex2", 0.f, alloc);
    if (dim == 2) {
        // Initialize 2D texture mapping _map_ from _tp_
        TextureMapping2DHandle map =
            TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

        return alloc.new_object<FloatCheckerboardTexture>(map, nullptr, tex1, tex2);
    } else {
        // Initialize 3D texture mapping _map_ from _tp_
        TextureMapping3DHandle map =
            TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
        return alloc.new_object<FloatCheckerboardTexture>(nullptr, map, tex1, tex2);
    }
}